

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O3

void __thiscall
flow_cutter::MultiCutter::
init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,DistanceType dist_type,
          vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *p,
          int max_flow_intensity,int random_seed,bool should_skip_non_maximum_sides)

{
  int iVar1;
  bool bVar2;
  pointer pDVar3;
  uint uVar4;
  ulong uVar5;
  pointer pSVar6;
  int iVar7;
  pointer pDVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  DistanceAwareCutter *this_00;
  bool bVar18;
  int local_6c;
  MultiCutter *local_68;
  int local_60;
  DistanceType local_5c;
  anon_class_16_2_5167d1e9 local_58;
  PierceNodeScore *local_48;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  
  pDVar3 = (this->cutter_list).
           super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar8 = (this->cutter_list).
           super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pDVar8 - (long)pDVar3;
  local_5c = dist_type;
  local_48 = score_pierce_node;
  while( true ) {
    uVar11 = (lVar10 >> 6) * -0x5c87b5f9d4d1bc25;
    pSVar6 = (p->
             super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(p->
                  super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6;
    uVar12 = (long)uVar5 >> 3;
    if (uVar11 < uVar12 || uVar11 - uVar12 == 0) break;
    (this->cutter_list).
    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar8 + -1;
    __gnu_cxx::new_allocator<flow_cutter::DistanceAwareCutter>::
    destroy<flow_cutter::DistanceAwareCutter>
              ((new_allocator<flow_cutter::DistanceAwareCutter> *)this,pDVar8 + -1);
    pDVar3 = (this->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar8 = (this->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar10 = (long)pDVar8 - (long)pDVar3;
  }
  if (uVar11 < uVar12) {
    do {
      std::vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>
      ::
      emplace_back<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&>
                ((vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>
                  *)this,graph);
      pDVar3 = (this->cutter_list).
               super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (p->
               super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(p->
                    super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6;
    } while ((ulong)(((long)(this->cutter_list).
                            super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 6) *
                    -0x5c87b5f9d4d1bc25) < (ulong)((long)uVar5 >> 3));
  }
  local_6c = 0;
  local_68 = this;
  if (0 < (int)(uVar5 >> 3)) {
    local_60 = random_seed + 1;
    do {
      this_00 = (local_68->cutter_list).
                super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                ._M_impl.super__Vector_impl_data._M_start + local_6c;
      my_score_pierce_node.score_pierce_node = local_48;
      my_score_pierce_node.i = &local_6c;
      DistanceAwareCutter::
      init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch>
                (this_00,graph,tmp,search_algo,local_5c,pSVar6[local_6c],max_flow_intensity,
                 local_6c + local_60);
      if (should_skip_non_maximum_sides) {
        while (local_58.score_pierce_node = (anon_class_16_2_0ed2c766 *)&my_score_pierce_node,
              local_58.this = this_00,
              bVar2 = BasicCutter::
                      does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:825:37)>
                                (&this_00->cutter,graph,&local_58), !bVar2) {
          local_58.score_pierce_node = (anon_class_16_2_0ed2c766 *)&my_score_pierce_node;
          local_58.this = this_00;
          BasicCutter::
          advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_flow_cutter::BreadthFirstSearch,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:810:37)>
                    (&this_00->cutter,graph,tmp,search_algo,(anon_class_16_2_5167d1e9 *)&local_58);
        }
      }
      local_6c = local_6c + 1;
      pSVar6 = (p->
               super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (uint)((ulong)((long)(p->
                                   super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 3)
      ;
    } while (local_6c < (int)uVar4);
    pDVar3 = (local_68->cutter_list).
             super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)uVar4) {
      uVar11 = 0x7fffffff;
      uVar5 = 0;
      uVar12 = 0xffffffff;
      iVar13 = 0;
      pDVar8 = pDVar3;
      do {
        iVar14 = *(int *)(pDVar8->cutter).assimilated;
        iVar1 = (pDVar8->cutter).reachable[0].node_set.node_count_inside_;
        iVar9 = (int)uVar11;
        if (iVar1 == iVar14) {
          iVar16 = (((AssimilatedNodeSet *)((long)(pDVar8->cutter).assimilated + 0x40))->node_set).
                   node_count_inside_;
          iVar7 = (((ReachableNodeSet *)((long)(pDVar8->cutter).reachable + 0x38))->node_set).
                  node_count_inside_;
          if (iVar16 < iVar1 && iVar7 == iVar16) {
            if (iVar9 <= (int)((ulong)((long)*(pointer *)((long)(pDVar8->cutter).assimilated + 0x70)
                                      - *(long *)&(((vector<int,_std::allocator<int>_> *)
                                                   ((long)(pDVar8->cutter).assimilated + 0x68))->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl) >> 2)) {
              iVar17 = (int)((ulong)((long)*(pointer *)((long)(pDVar8->cutter).assimilated + 0x70) -
                                    *(long *)&(((vector<int,_std::allocator<int>_> *)
                                               ((long)(pDVar8->cutter).assimilated + 0x68))->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    ) >> 2);
LAB_0012d65f:
              if ((iVar9 != iVar17) || (iVar7 <= iVar13)) goto LAB_0012d684;
              iVar7 = iVar16;
              if (iVar1 != iVar14) goto LAB_0012d672;
            }
            iVar16 = iVar7;
            iVar7 = (((ReachableNodeSet *)((long)(pDVar8->cutter).reachable + 0x38))->node_set).
                    node_count_inside_;
          }
          else if (iVar9 <= (int)((ulong)((long)*(pointer *)
                                                 ((long)(pDVar8->cutter).assimilated + 0x30) -
                                         *(long *)&(((vector<int,_std::allocator<int>_> *)
                                                    ((long)(pDVar8->cutter).assimilated + 0x28))->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl) >> 2)) {
            iVar17 = (int)((ulong)((long)*(pointer *)((long)(pDVar8->cutter).assimilated + 0x30) -
                                  *(long *)&(((vector<int,_std::allocator<int>_> *)
                                             ((long)(pDVar8->cutter).assimilated + 0x28))->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl)
                          >> 2);
            iVar7 = iVar1;
            goto LAB_0012d65f;
          }
          bVar18 = iVar7 == iVar16;
          uVar11 = (ulong)(iVar16 < iVar1 && bVar18);
          bVar2 = iVar16 < iVar1;
          iVar16 = iVar1;
          if (bVar2 && bVar18) {
            iVar16 = iVar7;
          }
          uVar11 = (ulong)(*(long *)((long)(pDVar8->cutter).assimilated + uVar11 * 0x40 + 0x30) -
                          *(long *)((long)(pDVar8->cutter).assimilated + uVar11 * 0x40 + 0x28)) >> 2
          ;
LAB_0012d681:
          uVar12 = uVar5 & 0xffffffff;
          iVar13 = iVar16;
        }
        else {
          uVar15 = (ulong)((long)*(pointer *)((long)(pDVar8->cutter).assimilated + 0x70) -
                          *(long *)&(((vector<int,_std::allocator<int>_> *)
                                     ((long)(pDVar8->cutter).assimilated + 0x68))->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl) >> 2;
          iVar14 = (int)uVar15;
          if (iVar14 < iVar9) {
            iVar16 = (((AssimilatedNodeSet *)((long)(pDVar8->cutter).assimilated + 0x40))->node_set)
                     .node_count_inside_;
            uVar11 = uVar15 & 0xffffffff;
            goto LAB_0012d681;
          }
          if ((iVar9 == iVar14) &&
             (iVar16 = (((AssimilatedNodeSet *)((long)(pDVar8->cutter).assimilated + 0x40))->
                       node_set).node_count_inside_, iVar13 < iVar16)) {
LAB_0012d672:
            uVar11 = (ulong)((long)*(pointer *)((long)(pDVar8->cutter).assimilated + 0x70) -
                            *(long *)&(((vector<int,_std::allocator<int>_> *)
                                       ((long)(pDVar8->cutter).assimilated + 0x68))->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl) >> 2;
            goto LAB_0012d681;
          }
        }
LAB_0012d684:
        iVar14 = (int)uVar12;
        uVar5 = uVar5 + 1;
        pDVar8 = pDVar8 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar5);
      goto LAB_0012d6a4;
    }
  }
  iVar14 = -1;
LAB_0012d6a4:
  local_68->current_cutter_id = iVar14;
  iVar13 = pDVar3[iVar14].cutter.reachable[0].node_set.node_count_inside_;
  if (iVar13 == *(int *)&pDVar3[iVar14].cutter) {
    iVar1 = (((AssimilatedNodeSet *)((long)pDVar3[iVar14].cutter.assimilated + 0x40))->node_set).
            node_count_inside_;
    iVar9 = (((ReachableNodeSet *)((long)pDVar3[iVar14].cutter.reachable + 0x38))->node_set).
            node_count_inside_;
    iVar14 = iVar13;
    if (iVar1 < iVar13) {
      iVar14 = iVar9;
    }
    if (iVar9 != iVar1) {
      iVar14 = iVar13;
    }
  }
  else {
    iVar14 = (((AssimilatedNodeSet *)((long)pDVar3[iVar14].cutter.assimilated + 0x40))->node_set).
             node_count_inside_;
  }
  local_68->current_smaller_side_size = iVar14;
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node, DistanceType dist_type,
        const std::vector<SourceTargetPair>& p, int max_flow_intensity, int random_seed,
        bool should_skip_non_maximum_sides = true)
    {
        while (cutter_list.size() > p.size())
            cutter_list.pop_back(); // can not use resize because that requires
                // default constructor...
        while (cutter_list.size() < p.size())
            cutter_list.emplace_back(graph);

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            auto my_score_pierce_node = [&](int x, int side,
                                            bool causes_augmenting_path,
                                            int source_dist, int target_dist) {
                return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                    target_dist, i);
            };

            x.init(graph, tmp, search_algo, dist_type, p[i], max_flow_intensity, random_seed + 1 + i);
            if (should_skip_non_maximum_sides)
                while (!x.does_next_advance_increase_cut(graph, my_score_pierce_node))
                    x.advance(graph, tmp, search_algo, my_score_pierce_node);
        }

        int best_cutter_id = -1;
        int best_cut_size = std::numeric_limits<int>::max();
        int best_cutter_weight = 0;

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            if ((int)x.get_current_cut().size() < best_cut_size || ((int)x.get_current_cut().size() == best_cut_size && x.get_current_smaller_cut_side_size() > best_cutter_weight)) {
                best_cutter_id = i;
                best_cut_size = x.get_current_cut().size();
                best_cutter_weight = x.get_current_smaller_cut_side_size();
            }
        }

        current_cutter_id = best_cutter_id;
        current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
    }